

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_ext.hpp
# Opt level: O0

string cs_impl::to_string<cs::type_id>(type_id *id)

{
  long in_RSI;
  proxy *in_RDI;
  char *in_stack_000003c8;
  string *val;
  proxy *__lhs;
  string local_80 [32];
  any *in_stack_ffffffffffffffa0;
  any *in_stack_ffffffffffffffa8;
  string local_50 [32];
  string local_30 [48];
  
  if (*(long *)(in_RSI + 8) == 0) {
    std::type_index::name((type_index *)0x15db85);
    cxx_demangle_abi_cxx11_(in_stack_000003c8);
  }
  else {
    __lhs = in_RDI;
    std::type_index::name((type_index *)0x15dab4);
    val = local_50;
    cxx_demangle_abi_cxx11_(in_stack_000003c8);
    std::operator+((any *)__lhs,&in_RDI->is_rvalue);
    to_string<unsigned_long>((unsigned_long *)val);
    std::operator+(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
    std::__cxx11::string::~string(local_80);
    std::__cxx11::string::~string(local_30);
    std::__cxx11::string::~string(local_50);
    in_RDI = __lhs;
  }
  return (string)in_RDI;
}

Assistant:

std::string to_string<cs::type_id>(const cs::type_id &id)
	{
		if (id.type_hash != 0)
			return cxx_demangle(id.type_idx.name()) + "_" + to_string(id.type_hash);
		else
			return cxx_demangle(id.type_idx.name());
	}